

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

bool __thiscall
Memory::HeapBucketGroup<SmallAllocationBlockAttributes>::AllocatorsAreEmpty
          (HeapBucketGroup<SmallAllocationBlockAttributes> *this)

{
  TBlockAllocatorType *pTVar1;
  TBlockAllocatorType *pTVar2;
  TBlockAllocatorType *pTVar3;
  TBlockAllocatorType *pTVar4;
  FreeObject *pFVar5;
  TBlockAllocatorType *pTVar6;
  SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *this_00;
  SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
  *this_01;
  SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *this_02;
  SmallHeapBlockAllocator<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
  *this_03;
  SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
  *this_04;
  
  pTVar1 = &(this->heapBucket).
            super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
            .super_HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>.
            allocatorHead;
  this_00 = pTVar1;
  while( true ) {
    if (this_00->heapBlock != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      return false;
    }
    pFVar5 = SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
             ::GetExplicitFreeList(this_00);
    if (pFVar5 != (FreeObject *)0x0) break;
    this_00 = this_00->next;
    if (this_00 == pTVar1) {
      pTVar2 = &(this->finalizableHeapBucket).
                super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
                .
                super_SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
                .
                super_HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
                .allocatorHead;
      this_01 = pTVar2;
      while( true ) {
        if (this_01->heapBlock != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0)
        {
          return false;
        }
        pFVar5 = SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
                 ::GetExplicitFreeList(this_01);
        if (pFVar5 != (FreeObject *)0x0) break;
        this_01 = this_01->next;
        if (this_01 == pTVar2) {
          pTVar3 = &(this->leafHeapBucket).
                    super_HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>.
                    allocatorHead;
          this_02 = pTVar3;
          while( true ) {
            if (this_02->heapBlock != (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
              return false;
            }
            pFVar5 = SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>
                     ::GetExplicitFreeList(this_02);
            if (pFVar5 != (FreeObject *)0x0) break;
            this_02 = this_02->next;
            if (this_02 == pTVar3) {
              pTVar4 = &(this->smallNormalWithBarrierHeapBucket).
                        super_SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                        .
                        super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                        .allocatorHead;
              this_03 = pTVar4;
              while( true ) {
                if (this_03->heapBlock !=
                    (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
                  return false;
                }
                pFVar5 = SmallHeapBlockAllocator<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                         ::GetExplicitFreeList(this_03);
                if (pFVar5 != (FreeObject *)0x0) break;
                this_03 = this_03->next;
                if (this_03 == pTVar4) {
                  pTVar6 = &(this->smallFinalizableWithBarrierHeapBucket).
                            super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                            .
                            super_SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                            .
                            super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                            .allocatorHead;
                  this_04 = pTVar6;
                  while ((this_04->heapBlock ==
                          (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)
                          0x0 && (pFVar5 = SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                                           ::GetExplicitFreeList(this_04),
                                 pFVar5 == (FreeObject *)0x0))) {
                    this_04 = this_04->next;
                    if (this_04 == pTVar6) {
                      return true;
                    }
                  }
                  return false;
                }
              }
              return false;
            }
          }
          return false;
        }
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool
HeapBucketGroup<TBlockAttributes>::AllocatorsAreEmpty()
{
    return heapBucket.AllocatorsAreEmpty()
        && finalizableHeapBucket.AllocatorsAreEmpty()
#ifdef RECYCLER_VISITED_HOST
        && recyclerVisitedHostHeapBucket.AllocatorsAreEmpty()
#endif
        && leafHeapBucket.AllocatorsAreEmpty()
#ifdef RECYCLER_WRITE_BARRIER
        && smallNormalWithBarrierHeapBucket.AllocatorsAreEmpty()
        && smallFinalizableWithBarrierHeapBucket.AllocatorsAreEmpty()
#endif
        ;
}